

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
ColumnSampler<double>::initialize<double>(ColumnSampler<double> *this,double *weights,size_t n_cols)

{
  bool bVar1;
  uint uVar2;
  pointer pdVar3;
  size_type sVar4;
  reference pvVar5;
  pointer in_RDX;
  long in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  double dVar6;
  size_t ix_1;
  size_t ix;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  ColumnSampler<double> *in_stack_ffffffffffffffa0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  
  (((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x48))->
  super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start =
       in_RDX;
  pdVar3 = (pointer)log2ceil((size_t)in_RDX);
  (((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x48))->
  super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_finish =
       pdVar3;
  bVar1 = std::vector<double,_std::allocator<double>_>::empty
                    ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (value_type_conflict *)in_stack_ffffffffffffffc0);
  }
  else {
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x18));
    if (sVar4 != 1L << ((char)(((vector<double,_std::allocator<double>_> *)
                               ((long)in_RDI._M_current + 0x48))->
                              super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish + 1U & 0x3f)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_RDI,in_stack_ffffffffffffffa8,(double *)in_stack_ffffffffffffffa0);
  }
  (((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x48))->
  super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((1L << ((byte)(((vector<double,_std::allocator<double>_> *)
                                ((long)in_RDI._M_current + 0x48))->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_finish & 0x3f)) + -1);
  for (pdVar3 = (pointer)0x0;
      pdVar3 < (((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x48))->
               super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
               _M_start; pdVar3 = (pointer)((long)pdVar3 + 1)) {
    dVar6 = *(double *)(in_RSI + (long)pdVar3 * 8);
    if (dVar6 <= 0.0) {
      dVar6 = 0.0;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x18),
                        (long)pdVar3 +
                        (long)(((vector<double,_std::allocator<double>_> *)
                               ((long)in_RDI._M_current + 0x48))->
                              super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
    *pvVar5 = dVar6;
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x18));
  while (sVar4 = sVar4 - 1, sVar4 != 0) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x18),
                        sVar4);
    in_stack_ffffffffffffffa0 = (ColumnSampler<double> *)*pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x18),
                        sVar4 - 1 >> 1);
    *pvVar5 = (double)in_stack_ffffffffffffffa0 + *pvVar5;
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x18),0)
  ;
  uVar2 = std::isnan(*pvVar5);
  bVar1 = true;
  if ((uVar2 & 1) == 0) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x18),
                        0);
    bVar1 = *pvVar5 <= 0.0;
  }
  if (bVar1) {
    drop_weights(in_stack_ffffffffffffffa0);
  }
  (((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x60))->
  super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  return;
}

Assistant:

void ColumnSampler<ldouble_safe>::initialize(real_t weights[], size_t n_cols)
{
    this->n_cols = n_cols;
    this->tree_levels = log2ceil(n_cols);
    if (this->tree_weights.empty())
        this->tree_weights.resize(pow2(this->tree_levels + 1), 0);
    else {
        if (this->tree_weights.size() != pow2(this->tree_levels + 1))
            this->tree_weights.resize(this->tree_levels);
        std::fill(this->tree_weights.begin(), this->tree_weights.end(), 0.);
    }

    /* compute sums for the tree leaves at each node */
    this->offset = pow2(this->tree_levels) - 1;
    for (size_t ix = 0; ix < this->n_cols; ix++)
        this->tree_weights[ix + this->offset] = std::fmax(0., weights[ix]);
    for (size_t ix = this->tree_weights.size() - 1; ix > 0; ix--)
        this->tree_weights[ix_parent(ix)] += this->tree_weights[ix];

    /* if the weights are invalid, make it an unweighted sampler */
    if (unlikely(std::isnan(this->tree_weights[0]) || this->tree_weights[0] <= 0))
    {
        this->drop_weights();
    }

    this->n_dropped = 0;
}